

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigUnfold2.c
# Opt level: O1

void Saig_ManFilterUsingInd2(Aig_Man_t *p,Vec_Vec_t *vCands,int nConfs,int nProps,int fVerbose)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  Aig_Man_t *p_00;
  Aig_Man_t *p_01;
  sat_solver *pSat;
  void **ppvVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  Aig_Man_t *__ptr;
  int in_R9D;
  Vec_Ptr_t *pVVar11;
  long lVar12;
  int Counter;
  uint local_84;
  
  p_00 = Saig_ManCreateIndMiter2(p,vCands);
  if ((long)vCands->nSize < 1) {
    iVar9 = 0;
  }
  else {
    lVar7 = 0;
    iVar9 = 0;
    do {
      iVar9 = iVar9 + *(int *)((long)vCands->pArray[lVar7] + 4);
      lVar7 = lVar7 + 1;
    } while (vCands->nSize != lVar7);
    iVar9 = iVar9 * 3;
  }
  if (p_00->nObjs[3] != iVar9) {
    __assert_fail("Aig_ManCoNum(pFrames) == Vec_VecSizeSize(vCands)*3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigUnfold2.c"
                  ,0x89,"void Saig_ManFilterUsingInd2(Aig_Man_t *, Vec_Vec_t *, int, int, int)");
  }
  p_01 = (Aig_Man_t *)Cnf_DeriveSimple(p_00,p_00->nObjs[3]);
  pcVar10 = (char *)p_01;
  pSat = (sat_solver *)Cnf_DataWriteIntoSolver((Cnf_Dat_t *)p_01,1,0);
  if (fVerbose != 0) {
    pcVar10 = "Filtered cands:  ";
    puts("Filtered cands:  ");
  }
  if (0 < vCands->nSize) {
    bVar4 = true;
    iVar9 = 0;
    lVar7 = 0;
    do {
      if (!bVar4) {
        __assert_fail("i==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigUnfold2.c"
                      ,0x93,"void Saig_ManFilterUsingInd2(Aig_Man_t *, Vec_Vec_t *, int, int, int)")
        ;
      }
      pvVar2 = vCands->pArray[lVar7];
      iVar5 = *(int *)((long)pvVar2 + 4);
      if (iVar5 < 1) {
        local_84 = 0;
      }
      else {
        lVar7 = 0;
        local_84 = 0;
        do {
          Counter = iVar9 + (int)lVar7;
          pvVar3 = *(void **)(*(long *)((long)pvVar2 + 8) + lVar7 * 8);
          iVar5 = Saig_ManFilterUsingIndOne2
                            ((Aig_Man_t *)pcVar10,p_00,pSat,(Cnf_Dat_t *)p_01,nConfs,in_R9D,Counter,
                             0);
          if (iVar5 == -1) {
            if (((int)local_84 < 0) || (*(int *)((long)pvVar2 + 4) <= (int)local_84)) {
LAB_0061f043:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            *(void **)(*(long *)((long)pvVar2 + 8) + (ulong)local_84 * 8) = pvVar3;
            if (fVerbose != 0) {
              pcVar10 = "!";
              if (((ulong)pvVar3 & 1) == 0) {
                pcVar10 = "";
              }
              printf("%d:%s%d \n",0,pcVar10,
                     (ulong)*(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 0x24));
            }
            pcVar8 = "!";
            if (((ulong)pvVar3 & 1) == 0) {
              pcVar8 = "";
            }
            pcVar10 = " type I : %d:%s%d \n";
            printf(" type I : %d:%s%d \n",0,pcVar8,
                   (ulong)*(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 0x24));
            pVVar11 = p->unfold2_type_I;
            uVar1 = pVVar11->nCap;
            if (pVVar11->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
LAB_0061ef4a:
                pcVar10 = (char *)pVVar11->pArray;
                if ((Aig_Man_t *)pcVar10 == (Aig_Man_t *)0x0) {
                  pcVar10 = (char *)0x80;
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(pcVar10,0x80);
                }
                pVVar11->pArray = ppvVar6;
                lVar12 = 0x10;
              }
              else {
                lVar12 = (ulong)uVar1 * 2;
                if ((int)lVar12 <= (int)uVar1) goto LAB_0061efb0;
LAB_0061ef80:
                __ptr = (Aig_Man_t *)pVVar11->pArray;
                pcVar10 = (char *)(lVar12 << 3);
                if (__ptr == (Aig_Man_t *)0x0) {
                  ppvVar6 = (void **)malloc((size_t)pcVar10);
                }
                else {
                  ppvVar6 = (void **)realloc(__ptr,(size_t)pcVar10);
                  pcVar10 = (char *)__ptr;
                }
                pVVar11->pArray = ppvVar6;
              }
              pVVar11->nCap = (int)lVar12;
            }
LAB_0061efb0:
            local_84 = local_84 + 1;
            iVar5 = pVVar11->nSize;
            pVVar11->nSize = iVar5 + 1;
            pVVar11->pArray[iVar5] = pvVar3;
          }
          else {
            iVar5 = Saig_ManFilterUsingIndOne2
                              ((Aig_Man_t *)pcVar10,p_00,pSat,(Cnf_Dat_t *)p_01,nConfs,in_R9D,
                               Counter,1);
            if ((iVar5 == 1) &&
               (iVar5 = Saig_ManFilterUsingIndOne2
                                  ((Aig_Man_t *)pcVar10,p_00,pSat,(Cnf_Dat_t *)p_01,nConfs,in_R9D,
                                   Counter,2), iVar5 == -1)) {
              if (fVerbose != 0) {
                pcVar10 = "!";
                if (((ulong)pvVar3 & 1) == 0) {
                  pcVar10 = "";
                }
                printf("%d:%s%d  \n",0,pcVar10,
                       (ulong)*(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 0x24));
              }
              pcVar8 = "!";
              if (((ulong)pvVar3 & 1) == 0) {
                pcVar8 = "";
              }
              pcVar10 = " type II: %d:%s%d  \n";
              printf(" type II: %d:%s%d  \n",0,pcVar8,
                     (ulong)*(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 0x24));
              if (((int)local_84 < 0) || (*(int *)((long)pvVar2 + 4) <= (int)local_84))
              goto LAB_0061f043;
              *(void **)(*(long *)((long)pvVar2 + 8) + (ulong)local_84 * 8) = pvVar3;
              pVVar11 = p->unfold2_type_II;
              uVar1 = pVVar11->nCap;
              if (pVVar11->nSize == uVar1) {
                if ((int)uVar1 < 0x10) goto LAB_0061ef4a;
                lVar12 = (ulong)uVar1 * 2;
                if ((int)uVar1 < (int)lVar12) goto LAB_0061ef80;
              }
              goto LAB_0061efb0;
            }
          }
          lVar7 = lVar7 + 1;
          iVar5 = *(int *)((long)pvVar2 + 4);
        } while (lVar7 < iVar5);
        iVar9 = iVar9 + (int)lVar7;
      }
      if (iVar5 < (int)local_84) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
      }
      *(uint *)((long)pvVar2 + 4) = local_84;
      lVar7 = 1;
      bVar4 = false;
    } while (1 < vCands->nSize);
  }
  Cnf_DataFree((Cnf_Dat_t *)p_01);
  sat_solver_delete(pSat);
  if (fVerbose != 0) {
    Aig_ManPrintStats(p_00);
  }
  Aig_ManStop(p_00);
  return;
}

Assistant:

void Saig_ManFilterUsingInd2( Aig_Man_t * p, Vec_Vec_t * vCands, int nConfs, int nProps, int fVerbose )
{
  Vec_Ptr_t * vNodes;
  Aig_Man_t * pFrames;
  sat_solver * pSat;
  Cnf_Dat_t * pCnf;
  Aig_Obj_t * pObj;
  int i, k, k2, Counter;
  /*
    Vec_VecForEachLevel( vCands, vNodes, i )
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
    printf( "%d ", Aig_ObjId(Aig_Regular(pObj)) );
    printf( "\n" );
  */
  // create timeframes 
  //    pFrames = Saig_ManUnrollInd( p );
  pFrames = Saig_ManCreateIndMiter2( p, vCands );
  assert( Aig_ManCoNum(pFrames) == Vec_VecSizeSize(vCands)*3 );
  // start the SAT solver
  pCnf = Cnf_DeriveSimple( pFrames, Aig_ManCoNum(pFrames) );
  pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
  // check candidates
  if ( fVerbose )
    printf( "Filtered cands:  \n" );
  Counter = 0;
  Vec_VecForEachLevel( vCands, vNodes, i )
    {
      assert(i==0);             /* only one item */
      k2 = 0;
      Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
          if ( Saig_ManFilterUsingIndOne2( p, pFrames, pSat, pCnf, nConfs, nProps, Counter++ , 0) == l_False)
            //            if ( Saig_ManFilterUsingIndOne_old( p, pSat, pCnf, nConfs, pObj ) )
            {
              Vec_PtrWriteEntry( vNodes, k2++, pObj );
              if ( fVerbose )
                printf( "%d:%s%d \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
              printf( " type I : %d:%s%d \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
              Vec_PtrPush(p->unfold2_type_I, pObj);
            }
          /* jlong -- begin  */
          else if ( Saig_ManFilterUsingIndOne2( p, pFrames, pSat, pCnf, nConfs, nProps, Counter-1 , 1) == l_True ) /* can be self-conflicting */
            {
              if ( Saig_ManFilterUsingIndOne2( p, pFrames, pSat, pCnf, nConfs, nProps, Counter-1 , 2) == l_False ){
                //Vec_PtrWriteEntry( vNodes, k2++, pObj );
                if ( fVerbose )
                  printf( "%d:%s%d  \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                printf( " type II: %d:%s%d  \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                Vec_PtrWriteEntry( vNodes, k2++, pObj ); /* add type II constraints */
                Vec_PtrPush(p->unfold2_type_II, pObj);
              }
            }
          /* jlong -- end  */
        }
      Vec_PtrShrink( vNodes, k2 );
    }

  // clean up
  Cnf_DataFree( pCnf );
  sat_solver_delete( pSat );
  if ( fVerbose )
    Aig_ManPrintStats( pFrames );
  Aig_ManStop( pFrames );
}